

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

int __thiscall FNodeBuilder::FVertexMapSimple::InsertVertex(FVertexMapSimple *this,FPrivVert *vert)

{
  FPrivVert *pFVar1;
  uint uVar2;
  FNodeBuilder *pFVar3;
  DWORD DVar4;
  DWORD DVar5;
  
  vert->segs = 0xffffffff;
  vert->segs2 = 0xffffffff;
  pFVar3 = this->MyBuilder;
  TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Grow(&pFVar3->Vertices,1);
  DVar4 = vert->segs;
  DVar5 = vert->segs2;
  pFVar1 = (pFVar3->Vertices).Array + (pFVar3->Vertices).Count;
  pFVar1->super_FSimpleVert = vert->super_FSimpleVert;
  pFVar1->segs = DVar4;
  pFVar1->segs2 = DVar5;
  uVar2 = (pFVar3->Vertices).Count;
  (pFVar3->Vertices).Count = uVar2 + 1;
  return uVar2;
}

Assistant:

int FNodeBuilder::FVertexMapSimple::InsertVertex (FNodeBuilder::FPrivVert &vert)
{
	vert.segs = DWORD_MAX;
	vert.segs2 = DWORD_MAX;
	return (int)MyBuilder.Vertices.Push (vert);
}